

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolorspace.cpp
# Opt level: O0

PrimaryPoints * QColorSpace::PrimaryPoints::fromPrimaries(Primaries primaries)

{
  undefined4 in_ESI;
  PrimaryPoints *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar1;
  PrimaryPoints *pPVar2;
  QPointF local_138;
  QPointF local_128;
  QPointF local_118;
  qreal local_108;
  qreal local_100;
  QPointF local_f8;
  QPointF local_e8;
  QPointF local_d8;
  qreal local_c8;
  qreal local_c0;
  QPointF local_b8;
  QPointF local_a8;
  QPointF local_98;
  qreal local_88;
  qreal local_80;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  qreal local_48;
  qreal local_40;
  QPointF local_38;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)&(in_RDI->bluePoint).xp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->bluePoint).xp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->bluePoint).yp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->bluePoint).yp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->greenPoint).xp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->greenPoint).xp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->greenPoint).yp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->greenPoint).yp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->redPoint).xp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->redPoint).xp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->redPoint).yp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->redPoint).yp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->whitePoint).xp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->whitePoint).xp + 4) = 0xffffffff;
  *(undefined4 *)&(in_RDI->whitePoint).yp = 0xffffffff;
  *(undefined4 *)((long)&(in_RDI->whitePoint).yp + 4) = 0xffffffff;
  pPVar2 = in_RDI;
  PrimaryPoints(in_RDI);
  switch(in_ESI) {
  case 1:
    QPointF::QPointF(&local_18,0.64,0.33);
    (in_RDI->redPoint).xp = local_18.xp;
    (in_RDI->redPoint).yp = local_18.yp;
    QPointF::QPointF(&local_28,0.3,0.6);
    (in_RDI->greenPoint).xp = local_28.xp;
    (in_RDI->greenPoint).yp = local_28.yp;
    QPointF::QPointF(&local_38,0.15,0.06);
    (in_RDI->bluePoint).xp = local_38.xp;
    (in_RDI->bluePoint).yp = local_38.yp;
    QVar1 = QColorVector::D65Chromaticity();
    local_40 = QVar1.yp;
    local_48 = QVar1.xp;
    (in_RDI->whitePoint).xp = local_48;
    (in_RDI->whitePoint).yp = local_40;
    break;
  case 2:
    QPointF::QPointF(&local_98,0.64,0.33);
    (in_RDI->redPoint).xp = local_98.xp;
    (in_RDI->redPoint).yp = local_98.yp;
    QPointF::QPointF(&local_a8,0.21,0.71);
    (in_RDI->greenPoint).xp = local_a8.xp;
    (in_RDI->greenPoint).yp = local_a8.yp;
    QPointF::QPointF(&local_b8,0.15,0.06);
    (in_RDI->bluePoint).xp = local_b8.xp;
    (in_RDI->bluePoint).yp = local_b8.yp;
    QVar1 = QColorVector::D65Chromaticity();
    local_c0 = QVar1.yp;
    local_c8 = QVar1.xp;
    (in_RDI->whitePoint).xp = local_c8;
    (in_RDI->whitePoint).yp = local_c0;
    break;
  case 3:
    QPointF::QPointF(&local_58,0.68,0.32);
    (in_RDI->redPoint).xp = local_58.xp;
    (in_RDI->redPoint).yp = local_58.yp;
    QPointF::QPointF(&local_68,0.265,0.69);
    (in_RDI->greenPoint).xp = local_68.xp;
    (in_RDI->greenPoint).yp = local_68.yp;
    QPointF::QPointF(&local_78,0.15,0.06);
    (in_RDI->bluePoint).xp = local_78.xp;
    (in_RDI->bluePoint).yp = local_78.yp;
    QVar1 = QColorVector::D65Chromaticity();
    local_80 = QVar1.yp;
    local_88 = QVar1.xp;
    (in_RDI->whitePoint).xp = local_88;
    (in_RDI->whitePoint).yp = local_80;
    break;
  case 4:
    QPointF::QPointF(&local_d8,0.7347,0.2653);
    (in_RDI->redPoint).xp = local_d8.xp;
    (in_RDI->redPoint).yp = local_d8.yp;
    QPointF::QPointF(&local_e8,0.1596,0.8404);
    (in_RDI->greenPoint).xp = local_e8.xp;
    (in_RDI->greenPoint).yp = local_e8.yp;
    QPointF::QPointF(&local_f8,0.0366,0.0001);
    (in_RDI->bluePoint).xp = local_f8.xp;
    (in_RDI->bluePoint).yp = local_f8.yp;
    QVar1 = QColorVector::D50Chromaticity();
    local_100 = QVar1.yp;
    local_108 = QVar1.xp;
    (in_RDI->whitePoint).xp = local_108;
    (in_RDI->whitePoint).yp = local_100;
    break;
  case 5:
    QPointF::QPointF(&local_118,0.708,0.292);
    (in_RDI->redPoint).xp = local_118.xp;
    (in_RDI->redPoint).yp = local_118.yp;
    QPointF::QPointF(&local_128,0.17,0.797);
    (in_RDI->greenPoint).xp = local_128.xp;
    (in_RDI->greenPoint).yp = local_128.yp;
    QPointF::QPointF(&local_138,0.131,0.046);
    (in_RDI->bluePoint).xp = local_138.xp;
    (in_RDI->bluePoint).yp = local_138.yp;
    QVar1 = QColorVector::D65Chromaticity();
    (in_RDI->whitePoint).xp = QVar1.xp;
    (in_RDI->whitePoint).yp = QVar1.yp;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pPVar2;
}

Assistant:

QColorSpace::PrimaryPoints QColorSpace::PrimaryPoints::fromPrimaries(Primaries primaries)
{
    PrimaryPoints out;
    switch (primaries) {
    case Primaries::SRgb:
        out.redPoint   = QPointF(0.640, 0.330);
        out.greenPoint = QPointF(0.300, 0.600);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::DciP3D65:
        out.redPoint   = QPointF(0.680, 0.320);
        out.greenPoint = QPointF(0.265, 0.690);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::AdobeRgb:
        out.redPoint   = QPointF(0.640, 0.330);
        out.greenPoint = QPointF(0.210, 0.710);
        out.bluePoint  = QPointF(0.150, 0.060);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    case Primaries::ProPhotoRgb:
        out.redPoint   = QPointF(0.7347, 0.2653);
        out.greenPoint = QPointF(0.1596, 0.8404);
        out.bluePoint  = QPointF(0.0366, 0.0001);
        out.whitePoint = QColorVector::D50Chromaticity();
        break;
    case Primaries::Bt2020:
        out.redPoint   = QPointF(0.708, 0.292);
        out.greenPoint = QPointF(0.170, 0.797);
        out.bluePoint  = QPointF(0.131, 0.046);
        out.whitePoint = QColorVector::D65Chromaticity();
        break;
    default:
        Q_UNREACHABLE();
    }
    return out;
}